

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

ssize_t __thiscall
jpgd::jpeg_decoder_mem_stream::read
          (jpeg_decoder_mem_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  undefined4 in_register_00000034;
  uint bytes_remaining;
  uint local_1c;
  uint local_4;
  
  *(undefined1 *)__nbytes = 0;
  if (this->m_pSrc_data == (uint8 *)0x0) {
    local_4 = 0xffffffff;
  }
  else {
    uVar1 = this->m_size - this->m_ofs;
    local_1c = (uint)__buf;
    if (uVar1 < (uint)__buf) {
      *(undefined1 *)__nbytes = 1;
      local_1c = uVar1;
    }
    memcpy((void *)CONCAT44(in_register_00000034,__fd),this->m_pSrc_data + this->m_ofs,
           (long)(int)local_1c);
    this->m_ofs = local_1c + this->m_ofs;
    local_4 = local_1c;
  }
  return (ulong)local_4;
}

Assistant:

int jpeg_decoder_mem_stream::read(uint8* pBuf, int max_bytes_to_read, bool* pEOF_flag) {
  *pEOF_flag = false;

  if (!m_pSrc_data)
    return -1;

  uint bytes_remaining = m_size - m_ofs;
  if ((uint)max_bytes_to_read > bytes_remaining) {
    max_bytes_to_read = bytes_remaining;
    *pEOF_flag = true;
  }

  memcpy(pBuf, m_pSrc_data + m_ofs, max_bytes_to_read);
  m_ofs += max_bytes_to_read;

  return max_bytes_to_read;
}